

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O2

wins * create_wins_array(int argc,char **argv,int *ar_len)

{
  int iVar1;
  uint uVar2;
  wins *pwVar3;
  Am_Drawonable *pAVar4;
  ulong uVar5;
  char *pcVar6;
  
  uVar2 = argc + (uint)(argc == 0);
  uVar5 = 0xffffffffffffffff;
  if (-1 < (int)uVar2) {
    uVar5 = (ulong)uVar2 << 6;
  }
  pwVar3 = (wins *)operator_new__(uVar5);
  if (argc < 2) {
    pcVar6 = (char *)0x0;
  }
  else {
    if (argc == 3) {
      pAVar4 = (Am_Drawonable *)Am_Drawonable::Get_Root_Drawonable(argv[1]);
      pwVar3->root = pAVar4;
      pAVar4 = (Am_Drawonable *)Am_Drawonable::Get_Root_Drawonable(argv[2]);
      pwVar3[1].root = pAVar4;
      iVar1 = 2;
      goto LAB_00105400;
    }
    if (argc != 2) {
      return pwVar3;
    }
    pcVar6 = argv[1];
  }
  pAVar4 = (Am_Drawonable *)Am_Drawonable::Get_Root_Drawonable(pcVar6);
  pwVar3->root = pAVar4;
  iVar1 = 1;
LAB_00105400:
  *ar_len = iVar1;
  return pwVar3;
}

Assistant:

wins *
create_wins_array(int argc, char **argv, int &ar_len)
{
  wins *wins_array = new wins[argc ? argc : 1];
  // On the Mac, argc is 0.  On Unix and PC, it is at least 1.
  if (argc <= 1) {
    wins_array[0].root = Am_Drawonable::Get_Root_Drawonable();
    ar_len = 1;
  } else if (argc == 2) {
    wins_array[0].root = Am_Drawonable::Get_Root_Drawonable(argv[1]);
    ar_len = 1;
  } else if (argc == 3) {
    wins_array[0].root = Am_Drawonable::Get_Root_Drawonable(argv[1]);
    wins_array[1].root = Am_Drawonable::Get_Root_Drawonable(argv[2]);
    ar_len = 2;
  }
  return wins_array;
}